

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O2

Cdr * __thiscall
eprosima::fastcdr::Cdr::serializeArray(Cdr *this,int32_t *long_t,size_t numElements)

{
  char **ppcVar1;
  ulong minSizeInc;
  char *pcVar2;
  bool bVar3;
  size_t sVar4;
  NotEnoughMemoryException *this_00;
  int32_t **ppiVar5;
  size_t __n;
  int32_t *long_t_local;
  
  ppiVar5 = &long_t_local;
  long_t_local = long_t;
  sVar4 = alignment(this,4);
  minSizeInc = sVar4 + numElements * 4;
  if ((ulong)((long)(this->m_lastPosition).m_currentPosition -
             (long)(this->m_currentPosition).m_currentPosition) < minSizeInc) {
    bVar3 = resize(this,minSizeInc);
    if (!bVar3) {
      this_00 = (NotEnoughMemoryException *)__cxa_allocate_exception(0x28);
      exception::NotEnoughMemoryException::NotEnoughMemoryException
                (this_00,&exception::NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
      __cxa_throw(this_00,&exception::NotEnoughMemoryException::typeinfo,
                  exception::NotEnoughMemoryException::~NotEnoughMemoryException);
    }
  }
  this->m_lastDataSize = 4;
  if (numElements != 0) {
    ppcVar1 = &(this->m_currentPosition).m_currentPosition;
    *ppcVar1 = *ppcVar1 + sVar4;
  }
  __n = numElements * 4;
  if (this->m_swapBytes == true) {
    for (; ppiVar5 < (char *)((long)&long_t_local + __n); ppiVar5 = (int32_t **)((long)ppiVar5 + 4))
    {
      pcVar2 = (this->m_currentPosition).m_currentPosition;
      (this->m_currentPosition).m_currentPosition = pcVar2 + 1;
      *pcVar2 = *(char *)((long)ppiVar5 + 3);
      pcVar2 = (this->m_currentPosition).m_currentPosition;
      (this->m_currentPosition).m_currentPosition = pcVar2 + 1;
      *pcVar2 = *(char *)((long)ppiVar5 + 2);
      pcVar2 = (this->m_currentPosition).m_currentPosition;
      (this->m_currentPosition).m_currentPosition = pcVar2 + 1;
      *pcVar2 = *(char *)((long)ppiVar5 + 1);
      pcVar2 = (this->m_currentPosition).m_currentPosition;
      (this->m_currentPosition).m_currentPosition = pcVar2 + 1;
      *pcVar2 = *(char *)ppiVar5;
    }
  }
  else {
    memcpy((this->m_currentPosition).m_currentPosition,long_t,__n);
    ppcVar1 = &(this->m_currentPosition).m_currentPosition;
    *ppcVar1 = *ppcVar1 + __n;
  }
  return this;
}

Assistant:

Cdr& Cdr::serializeArray(const int32_t *long_t, size_t numElements)
{
    size_t align = alignment(sizeof(*long_t));
    size_t totalSize = sizeof(*long_t) * numElements;
    size_t sizeAligned = totalSize + align;

    if(((m_lastPosition - m_currentPosition) >= sizeAligned) || resize(sizeAligned))
    {
        // Save last datasize.
        m_lastDataSize = sizeof(*long_t);

        // Align if there are any elements
        if(numElements)
            makeAlign(align);

        if(m_swapBytes)
        {
            const char *dst = reinterpret_cast<const char*>(&long_t);
            const char *end = dst + totalSize;

            for(; dst < end; dst += sizeof(*long_t))
            {
                m_currentPosition++ << dst[3];
                m_currentPosition++ << dst[2];
                m_currentPosition++ << dst[1];
                m_currentPosition++ << dst[0];
            }
        }
        else
        {
            m_currentPosition.memcopy(long_t, totalSize);
            m_currentPosition += totalSize;
        }

        return *this;
    }

    throw NotEnoughMemoryException(NotEnoughMemoryException::NOT_ENOUGH_MEMORY_MESSAGE_DEFAULT);
}